

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::TagAliasRegistry::expandAliases(TagAliasRegistry *this,string *unexpandedTestSpec)

{
  bool bVar1;
  string *in_RDX;
  long in_RSI;
  string *in_RDI;
  size_t pos;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  *registryKvp;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
  *__range1;
  string *expandedTestSpec;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
  *in_stack_ffffffffffffff08;
  string *__lhs;
  string local_d8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  long local_48;
  reference local_40;
  _Self local_38;
  _Self local_30;
  long local_28;
  undefined1 local_19;
  
  local_19 = 0;
  __lhs = in_RDI;
  std::__cxx11::string::string((string *)in_RDI,in_RDX);
  local_28 = in_RSI + 8;
  local_30._M_node =
       (_Base_ptr)
       clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
       ::begin(in_stack_ffffffffffffff08);
  local_38._M_node =
       (_Base_ptr)
       clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
       ::end(in_stack_ffffffffffffff08);
  while (bVar1 = clara::std::operator!=(&local_30,&local_38), bVar1) {
    local_40 = clara::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>
                            *)0x1441b4);
    local_48 = std::__cxx11::string::find((string *)in_RDI,(ulong)local_40);
    if (local_48 != -1) {
      std::__cxx11::string::substr((ulong)local_a8,(ulong)in_RDI);
      std::operator+(__lhs,in_RDI);
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_d8,(ulong)in_RDI);
      std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      std::__cxx11::string::operator=((string *)in_RDI,local_68);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
    }
    clara::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>
                  *)in_RDI);
  }
  return __lhs;
}

Assistant:

std::string TagAliasRegistry::expandAliases( std::string const& unexpandedTestSpec ) const {
        std::string expandedTestSpec = unexpandedTestSpec;
        for( auto const& registryKvp : m_registry ) {
            std::size_t pos = expandedTestSpec.find( registryKvp.first );
            if( pos != std::string::npos ) {
                expandedTestSpec =  expandedTestSpec.substr( 0, pos ) +
                                    registryKvp.second.tag +
                                    expandedTestSpec.substr( pos + registryKvp.first.size() );
            }
        }
        return expandedTestSpec;
    }